

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall psy::C::Lexer::lexUntilQuote(Lexer *this,SyntaxToken *tk,uchar quote,uint accLeng)

{
  int iVar1;
  CharacterConstant *pCVar2;
  uchar uVar3;
  uint size;
  char *s;
  
  s = this->yytext_ + ~(ulong)accLeng;
  uVar3 = this->yychar_;
  while (uVar3 != quote) {
    if (uVar3 == '\\') {
      lexBackslash(this,tk->syntaxK_);
    }
    else {
      if ((uVar3 == '\0') || (uVar3 == '\n')) break;
      yyinput(this);
    }
    uVar3 = this->yychar_;
  }
  iVar1 = *(int *)&this->yytext_;
  if (uVar3 == quote) {
    yyinput(this);
  }
  size = accLeng + (iVar1 - (int)s) + 1;
  if (quote == '\'') {
    pCVar2 = SyntaxTree::findOrInsertCharacterConstant(this->tree_,s,size);
  }
  else {
    pCVar2 = (CharacterConstant *)SyntaxTree::findOrInsertStringLiteral(this->tree_,s,size);
  }
  (tk->field_10).character_ = pCVar2;
  return;
}

Assistant:

void Lexer::lexUntilQuote(SyntaxToken* tk, unsigned char quote, unsigned int accLeng)
{
    const char* yytext = yytext_ - 1;
    yytext -= accLeng;

    while (yychar_
               && yychar_ != quote
               && yychar_ != '\n') {
        if (yychar_ == '\\')
            lexBackslash(tk->syntaxK_);
        else
            yyinput();
    }

    int yyleng = yytext_ - yytext + 1;
    yyleng += accLeng;

    if (yychar_ == quote)
        yyinput();

    if (quote == '\'')
        tk->character_ = tree_->findOrInsertCharacterConstant(yytext, yyleng);
    else
        tk->string_ = tree_->findOrInsertStringLiteral(yytext, yyleng);
}